

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O2

Am_Wrapper * find_feedback_proc(Am_Object *self)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object AStack_18;
  Am_Object window;
  
  window.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&AStack_18,(Am_Slot_Flags)self);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&AStack_18,0x68);
  Am_Object::operator=(&window,pAVar2);
  Am_Object::~Am_Object(&AStack_18);
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    pAVar3 = (Am_Wrapper *)0x0;
  }
  else {
    Am_Object::Get_Object((ushort)&AStack_18,(ulong)&window);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_18);
    Am_Object::~Am_Object(&AStack_18);
  }
  Am_Object::~Am_Object(&window);
  return pAVar3;
}

Assistant:

Am_Define_Object_Formula(find_feedback)
{
  Am_Object window;
  window = self.Get_Owner().Get(Am_WINDOW);
  if (window.Valid())
    return window.Get_Object(FEEDBACK);
  else
    return nullptr;
}